

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hh
# Opt level: O3

void __thiscall
Variant<int,std::__cxx11::string,char_const*>::Variant<std::__cxx11::string,void>
          (Variant<int,std::__cxx11::string,char_const*> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  
  *(undefined **)(this + 0x20) = &void::typeinfo;
  destroy0<std::__cxx11::string>(this,(type_index *)(this + 0x20),this);
  *(Variant<int,std::__cxx11::string,char_const*> **)this = this + 0x10;
  pcVar2 = (value->_M_dataplus)._M_p;
  paVar1 = &value->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&value->field_2 + 8);
    *(size_type *)(this + 0x10) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x18) = uVar3;
  }
  else {
    *(pointer *)this = pcVar2;
    *(size_type *)(this + 0x10) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 8) = value->_M_string_length;
  (value->_M_dataplus)._M_p = (pointer)paVar1;
  value->_M_string_length = 0;
  (value->field_2)._M_local_buf[0] = '\0';
  *(pointer_____offset_0x10___ **)(this + 0x20) = &std::__cxx11::string::typeinfo;
  return;
}

Assistant:

Variant(T&& value) : type_index_(typeid(void))
	{
			destroy(type_index_, &data_);
			typedef typename std::decay<T>::type U;
			new(&data_) U(std::forward<T>(value));
			type_index_ = std::type_index(typeid(U));
	}